

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.h
# Opt level: O2

void __thiscall kiste::html::escape(html *this,char *c)

{
  char cVar1;
  ostream *poVar2;
  
  cVar1 = *c;
  poVar2 = this->_os;
  if (cVar1 == '\"') {
    std::operator<<(poVar2,"&quot;");
    return;
  }
  if (cVar1 == '&') {
    std::operator<<(poVar2,"&amp;");
    return;
  }
  if (cVar1 == '\'') {
    std::operator<<(poVar2,"&#39;");
    return;
  }
  if (cVar1 != '>') {
    if (cVar1 == '<') {
      std::operator<<(poVar2,"&lt;");
      return;
    }
    std::operator<<(poVar2,cVar1);
    return;
  }
  std::operator<<(poVar2,"&gt;");
  return;
}

Assistant:

auto escape(const char& c) -> void
    {
      switch (c)
      {
      case '<':
        _os << "&lt;";
        break;
      case '>':
        _os << "&gt;";
        break;
      case '\'':
        _os << "&#39;";
        break;
      case '"':
        _os << "&quot;";
        break;
      case '&':
        _os << "&amp;";
        break;
      default:
        _os << c;
      }
    }